

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GenStateFindLiteral(jx9_gen_state *pGen,SyString *pValue,sxu32 *pIdx)

{
  SyHashEntry *pSVar1;
  SyHashEntry *pEntry;
  sxu32 *pIdx_local;
  SyString *pValue_local;
  jx9_gen_state *pGen_local;
  
  pSVar1 = SyHashGet(&pGen->hLiteral,pValue->zString,pValue->nByte);
  if (pSVar1 == (SyHashEntry *)0x0) {
    pGen_local._4_4_ = -6;
  }
  else {
    *pIdx = (sxu32)pSVar1->pUserData;
    pGen_local._4_4_ = 0;
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 GenStateFindLiteral(jx9_gen_state *pGen, const SyString *pValue, sxu32 *pIdx)
{
	SyHashEntry *pEntry;
	pEntry = SyHashGet(&pGen->hLiteral, (const void *)pValue->zString, pValue->nByte);
	if( pEntry == 0 ){
		return SXERR_NOTFOUND;
	}
	*pIdx = (sxu32)SX_PTR_TO_INT(pEntry->pUserData);
	return SXRET_OK;
}